

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int create_code(archive_read *a,huffman_code *code,uchar *lengths,int numsymbols,char maxlength)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  huffman_tree_node *phVar5;
  char *fmt;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  uint local_60;
  
  iVar1 = new_node(code);
  if (iVar1 < 0) {
LAB_0015cf44:
    fmt = "Unable to allocate memory for node data.";
    iVar1 = 0xc;
LAB_0015cf49:
    archive_set_error(&a->archive,iVar1,fmt);
    iVar1 = -0x1e;
  }
  else {
    code->numentries = 1;
    code->minlength = 0x7fffffff;
    code->maxlength = -0x80000000;
    uVar4 = 1;
    uVar6 = 0;
    local_60 = 2;
    iVar1 = numsymbols;
    do {
      if (0 < numsymbols) {
        uVar8 = 0;
        do {
          if (uVar4 == lengths[uVar8]) {
            free(code->table);
            code->table = (huffman_table_entry *)0x0;
            if (code->maxlength < (int)uVar4) {
              code->maxlength = uVar4;
            }
            if ((int)uVar4 < code->minlength) {
              code->minlength = uVar4;
            }
            phVar5 = code->tree;
            iVar3 = 0;
            uVar7 = local_60;
            do {
              if (phVar5[iVar3].branches[0] == phVar5[iVar3].branches[1]) goto LAB_0015cf19;
              bVar9 = (uVar6 >> (uVar7 - 2 & 0x1f) & 1) != 0;
              iVar2 = phVar5[iVar3].branches[bVar9];
              if (phVar5[iVar3].branches[bVar9] < 0) {
                iVar2 = new_node(code);
                if (iVar2 < 0) goto LAB_0015cf44;
                iVar2 = code->numentries;
                code->numentries = iVar2 + 1;
                phVar5 = code->tree;
                phVar5[iVar3].branches[bVar9] = iVar2;
              }
              iVar3 = iVar2;
              uVar7 = uVar7 - 1;
            } while (1 < uVar7);
            if ((phVar5[iVar3].branches[0] != -1) || (phVar5[iVar3].branches[1] != -2)) {
LAB_0015cf19:
              fmt = "Prefix found";
              iVar1 = 0x54;
              goto LAB_0015cf49;
            }
            phVar5[iVar3].branches[0] = (int)uVar8;
            phVar5[iVar3].branches[1] = (int)uVar8;
            uVar6 = uVar6 + 1;
            iVar3 = iVar1 + -1;
            bVar9 = iVar1 < 2;
            iVar1 = iVar3;
            if (bVar9) break;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)numsymbols);
      }
      uVar6 = uVar6 * 2;
      uVar4 = uVar4 + 1;
      local_60 = local_60 + 1;
    } while (uVar4 != 0x10);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
create_code(struct archive_read *a, struct huffman_code *code,
            unsigned char *lengths, int numsymbols, char maxlength)
{
  int i, j, codebits = 0, symbolsleft = numsymbols;

  if (new_node(code) < 0) {
    archive_set_error(&a->archive, ENOMEM,
                      "Unable to allocate memory for node data.");
    return (ARCHIVE_FATAL);
  }
  code->numentries = 1;
  code->minlength = INT_MAX;
  code->maxlength = INT_MIN;
  codebits = 0;
  for(i = 1; i <= maxlength; i++)
  {
    for(j = 0; j < numsymbols; j++)
    {
      if (lengths[j] != i) continue;
      if (add_value(a, code, j, codebits, i) != ARCHIVE_OK)
        return (ARCHIVE_FATAL);
      codebits++;
      if (--symbolsleft <= 0) { break; break; }
    }
    codebits <<= 1;
  }
  return (ARCHIVE_OK);
}